

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatareader.cpp
# Opt level: O2

UBool icu_63::CollationDataReader::isAcceptable
                (void *context,char *param_2,char *param_3,UDataInfo *pInfo)

{
  UBool UVar1;
  
  if (((((pInfo->size < 0x14) || (pInfo->isBigEndian != '\0')) || (pInfo->charsetFamily != '\0')) ||
      ((pInfo->dataFormat[0] != 'U' || (pInfo->dataFormat[1] != 'C')))) ||
     ((pInfo->dataFormat[2] != 'o' ||
      ((pInfo->dataFormat[3] != 'l' || (pInfo->formatVersion[0] != '\x05')))))) {
    UVar1 = '\0';
  }
  else {
    UVar1 = '\x01';
    if (context != (void *)0x0) {
      *(undefined4 *)context = *(undefined4 *)pInfo->dataVersion;
      return '\x01';
    }
  }
  return UVar1;
}

Assistant:

UBool U_CALLCONV
CollationDataReader::isAcceptable(void *context,
                                  const char * /* type */, const char * /*name*/,
                                  const UDataInfo *pInfo) {
    if(
        pInfo->size >= 20 &&
        pInfo->isBigEndian == U_IS_BIG_ENDIAN &&
        pInfo->charsetFamily == U_CHARSET_FAMILY &&
        pInfo->dataFormat[0] == 0x55 &&  // dataFormat="UCol"
        pInfo->dataFormat[1] == 0x43 &&
        pInfo->dataFormat[2] == 0x6f &&
        pInfo->dataFormat[3] == 0x6c &&
        pInfo->formatVersion[0] == 5
    ) {
        UVersionInfo *version = static_cast<UVersionInfo *>(context);
        if(version != NULL) {
            uprv_memcpy(version, pInfo->dataVersion, 4);
        }
        return TRUE;
    } else {
        return FALSE;
    }
}